

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  ulong uVar1;
  char *pcVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  int iVar10;
  undefined7 in_register_00000009;
  byte *pbVar11;
  ulong uVar12;
  byte *pbVar13;
  uint uVar14;
  byte *pbVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  
  uVar14 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar14 == 1) {
    lVar17 = 1;
    bVar16 = false;
    pbVar11 = (byte *)zNum;
  }
  else {
    uVar7 = 3 - uVar14;
    uVar12 = (ulong)uVar7;
    bVar16 = (int)uVar7 < length;
    if (((int)uVar7 < length) &&
       (uVar12 = 3 - (CONCAT71(in_register_00000009,enc) & 0xffffffff), zNum[uVar12] == '\0')) {
      uVar12 = 5 - (ulong)enc;
      do {
        bVar16 = (long)uVar12 < (long)length;
        if ((long)length <= (long)uVar12) goto LAB_0016aae1;
        uVar1 = uVar12 + 2;
        pcVar2 = zNum + uVar12;
        uVar12 = uVar1;
      } while (*pcVar2 == '\0');
      uVar12 = (ulong)((int)uVar1 - 2);
    }
LAB_0016aae1:
    length = (uint)uVar12 ^ 1;
    pbVar11 = (byte *)(zNum + (uVar14 & 1));
    lVar17 = 2;
  }
  pbVar15 = (byte *)(zNum + length);
  bVar5 = true;
  for (; pbVar9 = pbVar11, pbVar11 < pbVar15; pbVar11 = pbVar11 + lVar17) {
    bVar3 = *pbVar11;
    if ((""[bVar3] & 1) == 0) {
      if (bVar3 == 0x2b) {
        pbVar11 = pbVar11 + lVar17;
        pbVar9 = pbVar11;
      }
      else if (bVar3 == 0x2d) {
        pbVar11 = pbVar11 + lVar17;
        bVar5 = false;
        pbVar9 = pbVar11;
      }
      break;
    }
  }
  for (; (pbVar11 < pbVar15 && (*pbVar11 == 0x30)); pbVar11 = pbVar11 + lVar17) {
  }
  bVar21 = pbVar15 <= pbVar11;
  if ((bVar21) || (bVar3 = *pbVar11, 9 < (byte)(bVar3 - 0x30))) {
    lVar8 = 0;
    uVar14 = 0;
  }
  else {
    lVar8 = 0;
    uVar14 = 0;
    pbVar13 = pbVar11;
    do {
      pbVar13 = pbVar13 + lVar17;
      lVar8 = (ulong)bVar3 + lVar8 * 10 + -0x30;
      uVar14 = uVar14 + (int)lVar17;
      bVar21 = pbVar15 <= pbVar13;
      if (bVar21) break;
      bVar3 = *pbVar13;
    } while ((byte)(bVar3 - 0x30) < 10);
  }
  lVar20 = -0x8000000000000000;
  lVar18 = -lVar8;
  lVar19 = lVar20;
  if (bVar5) {
    lVar19 = 0x7fffffffffffffff;
    lVar18 = lVar8;
  }
  if (lVar8 < 0) {
    lVar18 = lVar19;
  }
  *pNum = lVar18;
  if ((uVar14 != 0) || (uVar7 = 0xffffffff, pbVar9 != pbVar11)) {
    if (bVar21 || bVar16 != false) {
      uVar7 = (uint)bVar16;
    }
    else {
      pbVar9 = pbVar11 + uVar14;
      do {
        if ((""[*pbVar9] & 1) == 0) {
          uVar7 = 1;
          goto LAB_0016ac07;
        }
        pbVar9 = pbVar9 + lVar17;
      } while (pbVar9 < pbVar15);
      uVar7 = 0;
    }
  }
LAB_0016ac07:
  uVar6 = (int)lVar17 * 0x13;
  if (uVar6 <= uVar14) {
    iVar10 = 1;
    if (uVar14 <= uVar6) {
      uVar12 = 0;
      pbVar15 = pbVar11;
      do {
        bVar3 = *pbVar15;
        bVar4 = "922337203685477580"[uVar12];
        if (0x10 < uVar12) break;
        uVar12 = uVar12 + 1;
        pbVar15 = pbVar15 + lVar17;
      } while (bVar3 == bVar4);
      if (bVar3 == bVar4) {
        iVar10 = (char)pbVar11[lVar17 * 0x12] + -0x38;
      }
      else {
        iVar10 = ((int)(char)bVar3 - (int)(char)bVar4) * 10;
      }
    }
    if (-1 < iVar10) {
      if (bVar5) {
        lVar20 = 0x7fffffffffffffff;
      }
      *pNum = lVar20;
      if (bVar5) {
        uVar7 = 3;
      }
      if (iVar10 != 0) {
        uVar7 = 2;
      }
    }
  }
  return uVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  int rc;          /* Baseline return code */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  testcase( i==18*incr );
  testcase( i==19*incr );
  testcase( i==20*incr );
  if( u>LARGEST_INT64 ){
    /* This test and assignment is needed only to suppress UB warnings
    ** from clang and -fsanitize=undefined.  This test and assignment make
    ** the code a little larger and slower, and no harm comes from omitting
    ** them, but we must appaise the undefined-behavior pharisees. */
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  rc = 0;
  if( i==0 && zStart==zNum ){    /* No digits */
    rc = -1;
  }else if( nonNum ){            /* UTF16 with high-order bytes non-zero */
    rc = 1;
  }else if( &zNum[i]<zEnd ){     /* Extra bytes at the end */
    int jj = i;
    do{
      if( !sqlite3Isspace(zNum[jj]) ){
        rc = 1;          /* Extra non-space text after the integer */
        break;
      }
      jj += incr;
    }while( &zNum[jj]<zEnd );
  }
  if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return rc;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = i>19*incr ? 1 : compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return rc;
    }else{
      *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
      if( c>0 ){
        /* zNum is greater than 9223372036854775808 so it overflows */
        return 2;
      }else{
        /* zNum is exactly 9223372036854775808.  Fits if negative.  The
        ** special case 2 overflow if positive */
        assert( u-1==LARGEST_INT64 );
        return neg ? rc : 3;
      }
    }
  }
}